

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_ObjRef> *a)

{
  bool bVar1;
  bool bVar2;
  ON_ObjRef *this_00;
  int iVar3;
  int count;
  int local_1c;
  
  ON_ClassArray<ON_ObjRef>::Empty(a);
  bVar1 = ReadInt(this,&local_1c);
  iVar3 = 0;
  bVar2 = false;
  if (bVar1) {
    ON_ClassArray<ON_ObjRef>::SetCapacity(a,(long)local_1c);
    bVar2 = true;
    while ((iVar3 < local_1c && (bVar2 != false))) {
      this_00 = ON_ClassArray<ON_ObjRef>::AppendNew(a);
      bVar2 = ON_ObjRef::Read(this_00,this);
      iVar3 = iVar3 + 1;
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_ClassArray<ON_ObjRef>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = a.AppendNew().Read(*this);
    }
  }
  return rc;
}